

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Socket *this;
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ostream *poVar1;
  reference_type pbVar2;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  undefined4 extraout_EDX;
  int __n;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int __fd;
  undefined1 local_a8 [8];
  Reader client_reader;
  tuple<int,_sockaddr_in> result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  line_read;
  Socket sk;
  
  this = (Socket *)((long)&line_read.super_type.m_storage.dummy_ + 0x18);
  rookie::Socket::Socket(this);
  __fd = 0x18aa;
  rookie::Socket::bind(this,0x18aa,(sockaddr *)CONCAT44(extraout_var,extraout_EDX),in_ECX);
  rookie::Socket::listen((Socket *)((long)&line_read.super_type.m_storage.dummy_ + 0x18),__fd,__n);
  rookie::Socket::accept
            ((Socket *)((long)&client_reader.buf_.field_2 + 0xc),(int)&line_read + 0x20,
             (sockaddr *)CONCAT44(extraout_var_00,extraout_EDX_00),
             (socklen_t *)CONCAT44(in_register_0000000c,in_ECX));
  poVar1 = std::operator<<((ostream *)&std::cout,"Connection established! fd is ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar1,
                      result.super__Tuple_impl<0UL,_int,_sockaddr_in>.
                      super__Tuple_impl<1UL,_sockaddr_in>.super__Head_base<1UL,_sockaddr_in,_false>.
                      _M_head_impl.sin_zero._0_4_);
  poVar1 = std::operator<<(poVar1,".");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_a8[0] = result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[0];
  local_a8[1] = result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[1];
  local_a8[2] = result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[2];
  local_a8[3] = result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[3];
  client_reader._0_8_ = &client_reader.buf_._M_string_length;
  client_reader.buf_._M_dataplus._M_p = (pointer)0x0;
  client_reader.buf_._M_string_length._0_1_ = 0;
  this_00 = (optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero + 4);
  while( true ) {
    rookie::Reader::readLine_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00,(Reader *)local_a8);
    if (result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
        super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[4] == '\0') break;
    pbVar2 = boost::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_00);
    std::operator<<((ostream *)&std::cout,(string *)pbVar2);
    boost::optional_detail::
    optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional_base(this_00);
  }
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(result.super__Tuple_impl<0UL,_int,_sockaddr_in>.
                     super__Tuple_impl<1UL,_sockaddr_in>.super__Head_base<1UL,_sockaddr_in,_false>.
                     _M_head_impl.sin_zero + 4));
  std::__cxx11::string::~string((string *)&client_reader);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sk.fd_);
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    boost::ignore_unused(argc);
    boost::ignore_unused(argv);

    Socket sk;
    sk.bind(6314);
    sk.listen();
    auto result = sk.accept();
    int fd = std::get<0>(result);
    std::cout << "Connection established! fd is " << fd << "." << std::endl;

    Reader client_reader(fd);

    for( ; ; ){
        boost::optional<std::string> line_read = client_reader.readLine();
        if (!line_read) break;
        std::cout << line_read.value();
    }
    return 0;
}